

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadPointLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  undefined8 *in_RDX;
  XMLLoader *this_00;
  string *childID;
  AffineSpace3fa space;
  undefined1 local_b0 [32];
  FILE *pFStack_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pp_Var2 = local_88._vptr__Sp_counted_base;
  this_00 = (XMLLoader *)*in_RDX;
  local_88._7_4_ = 0x65636170;
  local_88._vptr__Sp_counted_base._0_7_ = 0x53656e69666641;
  pFStack_90 = (FILE *)0xb;
  local_88._M_weak_count = (_Atomic_word)((ulong)pp_Var2 >> 0x20);
  local_88._M_use_count._3_1_ = 0;
  local_b0._24_8_ = &local_88;
  XML::child((XML *)local_b0,(string *)this_00);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_00,(Ref<embree::XML> *)local_b0);
  if ((long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_b0._4_4_,local_b0._0_4_) + 0x18))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._24_8_ != &local_88) {
    operator_delete((void *)local_b0._24_8_);
  }
  childID = (string *)*in_RDX;
  local_88._vptr__Sp_counted_base._0_2_ = 0x49;
  pFStack_90 = (FILE *)0x1;
  local_b0._24_8_ = &local_88;
  XML::child((XML *)(local_b0 + 0x10),childID);
  load<embree::Vec3<float>>((XMLLoader *)local_b0,(Ref<embree::XML> *)childID);
  local_78._4_4_ = local_b0._8_4_;
  local_78._0_4_ = local_b0._4_4_;
  local_78._8_8_ = 0;
  local_68 = ZEXT416((uint)local_b0._0_4_);
  if ((element_type *)local_b0._16_8_ != (element_type *)0x0) {
    (**(code **)(*(long *)local_b0._16_8_ + 0x18))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._24_8_ != &local_88) {
    operator_delete((void *)local_b0._24_8_);
  }
  aVar1._M_allocated_capacity._4_4_ = local_78._0_4_;
  aVar1._M_allocated_capacity._0_4_ = local_68._0_4_;
  aVar1._8_4_ = local_78._4_4_;
  aVar1._12_4_ = 0;
  local_b0._24_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pFStack_90 = (FILE *)0x0;
  local_88._vptr__Sp_counted_base._4_4_ = local_78._0_4_;
  local_88._vptr__Sp_counted_base._0_4_ = local_68._0_4_;
  local_88._M_use_count = local_78._4_4_;
  local_88._M_weak_count = 0;
  local_78 = (undefined1  [16])aVar1;
  pcVar3 = (pointer)alignedMalloc(0xa0,0x10);
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  *(pointer *)(pcVar3 + 0x10) = pcVar3 + 0x20;
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0x20] = '\0';
  *(pointer *)(pcVar3 + 0x30) = pcVar3 + 0x40;
  pcVar3[0x38] = '\0';
  pcVar3[0x39] = '\0';
  pcVar3[0x3a] = '\0';
  pcVar3[0x3b] = '\0';
  pcVar3[0x3c] = '\0';
  pcVar3[0x3d] = '\0';
  pcVar3[0x3e] = '\0';
  pcVar3[0x3f] = '\0';
  pcVar3[0x40] = '\0';
  pcVar3[0x50] = '\0';
  pcVar3[0x51] = '\0';
  pcVar3[0x52] = '\0';
  pcVar3[0x53] = '\0';
  pcVar3[0x54] = '\0';
  pcVar3[0x55] = '\0';
  pcVar3[0x56] = '\0';
  pcVar3[0x57] = '\0';
  pcVar3[0x58] = '\0';
  pcVar3[0x59] = '\0';
  pcVar3[0x5c] = -1;
  pcVar3[0x5d] = -1;
  pcVar3[0x5e] = -1;
  pcVar3[0x5f] = -1;
  pcVar3[0x60] = '\0';
  pcVar3[0x61] = '\0';
  pcVar3[0x62] = '\0';
  pcVar3[99] = '\0';
  pcVar3[100] = '\0';
  pcVar3[0x65] = '\0';
  pcVar3[0x66] = '\0';
  pcVar3[0x67] = '\0';
  *(undefined ***)pcVar3 = &PTR__Node_002c6880;
  pcVar3[0x70] = '\x01';
  pcVar3[0x71] = '\0';
  pcVar3[0x72] = '\0';
  pcVar3[0x73] = '\0';
  *(float *)(pcVar3 + 0x80) =
       local_58.m128[0] * 0.0 +
       (float)local_b0._28_4_ * local_48 + pFStack_90._0_4_ * local_38 + local_28;
  *(float *)(pcVar3 + 0x84) =
       local_58.m128[1] * 0.0 +
       (float)local_b0._28_4_ * fStack_44 + pFStack_90._0_4_ * fStack_34 + fStack_24;
  *(float *)(pcVar3 + 0x88) =
       local_58.m128[2] * 0.0 +
       (float)local_b0._28_4_ * fStack_40 + pFStack_90._0_4_ * fStack_30 + fStack_20;
  *(float *)(pcVar3 + 0x8c) =
       local_58.m128[3] * 0.0 +
       (float)local_b0._28_4_ * fStack_3c + pFStack_90._0_4_ * fStack_2c + fStack_1c;
  *(undefined8 *)(pcVar3 + 0x90) = local_78._0_8_;
  *(undefined8 *)(pcVar3 + 0x98) = local_78._8_8_;
  (this->path).filename._M_dataplus._M_p = pcVar3;
  LOCK();
  *(long *)(pcVar3 + 8) = *(long *)(pcVar3 + 8) + 1;
  UNLOCK();
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadPointLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa I = load<Vec3f>(xml->child("I"));
    const Vec3fa P = Vec3fa(zero);
    const SceneGraph::PointLight light = SceneGraph::PointLight(P,I);
    return new SceneGraph::LightNodeImpl<SceneGraph::PointLight>(light.transform(space));
  }